

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::_preprocessAndSolveReal
          (SoPlexBase<double> *this,bool applySimplifier,bool *interrupt)

{
  SPxSolverBase<double> *this_00;
  double dVar1;
  Statistics *pSVar2;
  SPxLPBase<double> *this_01;
  Settings *pSVar3;
  SPxScaler<double> *pSVar4;
  Result simplificationStatus;
  double *pdVar5;
  byte bVar6;
  undefined7 in_register_00000031;
  bool bVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  pSVar2 = this->_statistics;
  (this->_solver).super_SPxLPBase<double>.offset = this->_currentSettings->_realParamValues[0x17];
  (*pSVar2->preprocessingTime->_vptr_Timer[3])();
  this->_applyPolishing = false;
  if ((int)CONCAT71(in_register_00000031,applySimplifier) == 0) {
    this->_simplifier = (SPxSimplifier<double> *)0x0;
    if (this->_isRealLPScaled == false) {
      this->_scaler = (SPxScaler<double> *)0x0;
    }
LAB_0033b5de:
    if (this->_scaler == (SPxScaler<double> *)0x0) {
      bVar6 = 0;
    }
    else {
      bVar6 = this->_isRealLPScaled ^ 1;
    }
  }
  else {
    _enableSimplifierAndScaler(this);
    bVar6 = 1;
    if (this->_simplifier == (SPxSimplifier<double> *)0x0) goto LAB_0033b5de;
  }
  if ((this->_solver).useTerminationValue == true) {
    (this->_solver).objLimit =
         this->_currentSettings->_realParamValues
         [(ulong)(this->_currentSettings->_intParamValues[0] == -1) + 8];
  }
  else {
    ::soplex::infinity::__tls_init();
    pdVar5 = (double *)__tls_get_addr(&PTR_003b4b70);
    (this->_solver).objLimit = *pdVar5;
    (this->_solver).useTerminationValue = true;
  }
  this_00 = &this->_solver;
  if (this->_isRealLPLoaded == true) {
    if (bVar6 == 0) goto LAB_0033b70f;
    this->_realLP = (SPxLPBase<double> *)0x0;
    spx_alloc<soplex::SPxLPBase<double>*>(&this->_realLP,1);
    this_01 = this->_realLP;
    SPxLPBase<double>::SPxLPBase(this_01,&this_00->super_SPxLPBase<double>);
    this->_realLP = this_01;
    bVar7 = false;
  }
  else {
    if (this->_hasBasis == true) {
      SPxSolverBase<double>::loadLP(this_00,this->_realLP,false);
      SPxSolverBase<double>::setBasis
                (this_00,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    }
    else {
      SPxSolverBase<double>::loadLP(this_00,this->_realLP,true);
    }
    if (bVar6 != 0) goto LAB_0033b70f;
    (**(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
       super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)();
    free(this->_realLP);
    this->_realLP = &this_00->super_SPxLPBase<double>;
    bVar7 = true;
  }
  this->_isRealLPLoaded = bVar7;
LAB_0033b70f:
  if (this->_simplifier == (SPxSimplifier<double> *)0x0) {
    simplificationStatus = OKAY;
  }
  else {
    pSVar3 = this->_currentSettings;
    bVar7 = pSVar3->_intParamValues[0xe] == 3;
    if ((pSVar3->_intParamValues[1] == 2) ||
       ((pSVar3->_intParamValues[1] == 0 &&
        ((double)((this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                  super_SVSetBase<double>.set.thenum + 1) * pSVar3->_realParamValues[0x10] <
         (double)((this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                  super_SVSetBase<double>.set.thenum + 1))))) {
      bVar7 = (bool)(pSVar3->_intParamValues[0xe] == 3 & pSVar3->_boolParamValues[8]);
    }
    dVar1 = (this->_solver).maxTime;
    (*((this->_solver).theTime)->_vptr_Timer[6])();
    simplificationStatus =
         (*this->_simplifier->_vptr_SPxSimplifier[5])
                   (dVar1 - extraout_XMM0_Qa,this->_simplifier,this_00,(ulong)bVar7,
                    (ulong)(this->_solver).random.seedshift);
    (*this->_simplifier->_vptr_SPxSimplifier[0x10])();
    (this->_solver).super_SPxLPBase<double>.offset =
         extraout_XMM0_Qa_00 + this->_currentSettings->_realParamValues[0x17];
    (this->_solver).super_SPxLPBase<double>._isScaled = false;
    this->_applyPolishing = true;
    (this->_solver).polishObj = POLISH_OFF;
  }
  (*this->_statistics->preprocessingTime->_vptr_Timer[4])();
  if (simplificationStatus == OKAY) {
    pSVar4 = this->_scaler;
    if ((pSVar4 != (SPxScaler<double> *)0x0) &&
       ((this->_solver).super_SPxLPBase<double>._isScaled == false)) {
      (*pSVar4->_vptr_SPxScaler[0xd])(pSVar4,this_00,0);
      SPxBasisBase<double>::invalidate(&(this->_solver).super_SPxBasisBase<double>);
      (*(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this_00);
      (*(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(this_00);
    }
    _solveRealLPAndRecordStatistics(this,interrupt);
    simplificationStatus = OKAY;
  }
  _evaluateSolutionReal(this,simplificationStatus);
  return;
}

Assistant:

void SoPlexBase<R>::_preprocessAndSolveReal(bool applySimplifier, volatile bool* interrupt)
{
   _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
   _statistics->preprocessingTime->start();

   _applyPolishing = false;

   if(applySimplifier)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

   // create a copy of the LP when simplifying or when using internal scaling, i.e. w/o persistent scaling
   bool copyLP = (_simplifier != nullptr || (_scaler && !_isRealLPScaled));

   // set the objective limit if it was not explicitly disabled for this particular solving call
   if(_solver.isTerminationValueEnabled())
   {
      _solver.setTerminationValue(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                                  ? realParam(SoPlexBase<R>::OBJLIMIT_UPPER) : realParam(SoPlexBase<R>::OBJLIMIT_LOWER));
   }
   // reset the objective limit and reenabled it for the next solve
   else
   {
      _solver.setTerminationValue();
      _solver.toggleTerminationValue(true);
   }

   if(_isRealLPLoaded)
   {
      assert(_realLP == &_solver);

      // preprocessing is always applied to the LP in the solver; hence we have to create a copy of the original LP
      // if simplifier is turned on
      if(copyLP)
      {
         _realLP = nullptr;
         spx_alloc(_realLP);
         _realLP = new(_realLP) SPxLPBase<R>(_solver);
         _isRealLPLoaded = false;
      }
   }
   else
   {
      assert(_realLP != &_solver);

      // load real LP and basis if available
      if(_hasBasis)
      {
         assert(_basisStatusRows.size() == numRows());
         assert(_basisStatusCols.size() == this->numCols());

         _solver.loadLP(*_realLP, false);
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      }
      // load real LP and set up slack basis
      else
         _solver.loadLP(*_realLP, true);

      // if there is no simplifier, then the original and the transformed problem are identical and it is more
      // memory-efficient to keep only the problem in the solver
      if(!copyLP)
      {
         _realLP->~SPxLPBase<R>();
         spx_free(_realLP);
         _realLP = &_solver;
         _isRealLPLoaded = true;
      }
   }

   // assert that we have two problems if and only if we apply the simplifier
   assert(_realLP == &_solver || copyLP);
   assert(_realLP != &_solver || !copyLP);

   // apply problem simplification
   typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

   if(_simplifier)
   {
      assert(!_isRealLPLoaded);
      // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used; also respect row-boundflip parameter
      bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

      if(intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
         keepbounds &= boolParam(SoPlexBase<R>::ROWBOUNDFLIPS);

      Real remainingTime = _solver.getMaxTime() - _solver.time();
      simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                             _solver.random.getSeed());
      _solver.changeObjOffset(_simplifier->getObjoffset() + realParam(SoPlexBase<R>::OBJ_OFFSET));
      _solver.setScalingInfo(false);
      _applyPolishing = true;

      _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
   }

   _statistics->preprocessingTime->stop();

   // run the simplex method if problem has not been solved by the simplifier
   if(simplificationStatus == SPxSimplifier<R>::OKAY)
   {
      if(_scaler && !_solver.isScaled())
      {
         _scaler->scale(_solver, false);
         _solver.invalidateBasis();
      }

      _solveRealLPAndRecordStatistics(interrupt);
   }

   _evaluateSolutionReal(simplificationStatus);
}